

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

void load_input_model(vw *all,io_buf *io_temp)

{
  size_t __n;
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  base_learner *pbVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string local_60;
  string local_40;
  
  __n = (all->feature_mask)._M_string_length;
  if ((((__n == 0) ||
       (pbVar1 = (all->initial_regressors).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (all->initial_regressors).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish == pbVar1)) || (__n != pbVar1->_M_string_length))
     || (iVar3 = bcmp((all->feature_mask)._M_dataplus._M_p,(pbVar1->_M_dataplus)._M_p,__n),
        iVar3 != 0)) {
    pcVar2 = (all->feature_mask)._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar2,pcVar2 + __n);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_90,&all->initial_regressors);
    parse_mask_regressor_args(all,&local_60,&local_90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    pbVar4 = all->l;
    do {
      (**(code **)(pbVar4 + 0x80))(*(undefined8 *)(pbVar4 + 0x70),io_temp,1,0);
      pbVar4 = *(base_learner **)(pbVar4 + 0x78);
    } while (pbVar4 != (base_learner *)0x0);
    (*io_temp->_vptr_io_buf[8])(io_temp);
    return;
  }
  pbVar4 = all->l;
  do {
    (**(code **)(pbVar4 + 0x80))(*(undefined8 *)(pbVar4 + 0x70),io_temp,1,0);
    pbVar4 = *(base_learner **)(pbVar4 + 0x78);
  } while (pbVar4 != (base_learner *)0x0);
  (*io_temp->_vptr_io_buf[8])(io_temp);
  pcVar2 = (all->feature_mask)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + (all->feature_mask)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,&all->initial_regressors);
  parse_mask_regressor_args(all,&local_40,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p == &local_40.field_2) {
    return;
  }
  operator_delete(local_40._M_dataplus._M_p);
  return;
}

Assistant:

void load_input_model(vw& all, io_buf& io_temp)
{
  // Need to see if we have to load feature mask first or second.
  // -i and -mask are from same file, load -i file first so mask can use it
  if (!all.feature_mask.empty() && all.initial_regressors.size() > 0 && all.feature_mask == all.initial_regressors[0])
  {
    // load rest of regressor
    all.l->save_load(io_temp, true, false);
    io_temp.close_file();

    parse_mask_regressor_args(all, all.feature_mask, all.initial_regressors);
  }
  else
  {  // load mask first
    parse_mask_regressor_args(all, all.feature_mask, all.initial_regressors);

    // load rest of regressor
    all.l->save_load(io_temp, true, false);
    io_temp.close_file();
  }
}